

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NameFinder.cpp
# Opt level: O3

vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_> *
__thiscall
OpenMD::NameFinder::getMatchedChildren
          (vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
           *__return_storage_ptr__,NameFinder *this,TreeNodePtr *node,string *name)

{
  element_type *peVar1;
  int iVar2;
  _Base_ptr p_Var3;
  
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  peVar1 = (node->super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var3 = *(_Base_ptr *)
            ((long)&(peVar1->children)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
  if ((_Rb_tree_header *)p_Var3 != &(peVar1->children)._M_t._M_impl.super__Rb_tree_header) {
    do {
      iVar2 = Wildcard::wildcardfit((name->_M_dataplus)._M_p,*(char **)(p_Var3 + 1));
      if (0 < iVar2) {
        std::
        vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
        ::push_back(__return_storage_ptr__,(value_type *)(p_Var3 + 2));
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 !=
             &(((node->super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              children)._M_t._M_impl.super__Rb_tree_header);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<TreeNodePtr> NameFinder::getMatchedChildren(
      TreeNodePtr node, const std::string& name) {
    std::vector<TreeNodePtr> matchedNodes;
    std::map<std::string, TreeNodePtr>::iterator i;
    for (i = node->children.begin(); i != node->children.end(); ++i) {
      if (isMatched(i->first, name)) { matchedNodes.push_back(i->second); }
    }

    return matchedNodes;
  }